

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O3

void __thiscall
CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string&>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
          *func,char_data **args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  pointer pcVar1;
  string_view fmt;
  string_view fmt_00;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  tuple<char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  tuple;
  int local_114;
  string *local_110;
  vector<char_data_*,_std::allocator<char_data_*>_> local_108;
  undefined1 local_f0 [16];
  long *local_e0;
  long local_d0 [2];
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  vector<char_data_*,_std::allocator<char_data_*>_> local_78;
  _Any_data local_60;
  _Manager_type local_50;
  tuple<char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_40;
  
  local_114 = nTimer;
  local_110 = funcName;
  if (nTimer < 0) {
    local_c0 = (undefined1  [8])0x2;
    fmt._M_str = "Negative Queue Timer - NumArgs: {}";
    fmt._M_len = 0x22;
    CLogger::Warn<unsigned_long>((CLogger *)&Logger,fmt,(unsigned_long *)local_c0);
  }
  local_40.
  super__Tuple_impl<0UL,_char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .
  super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
  ._M_head_impl =
       (_Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
        )(_Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
          )args_1;
  local_40.
  super__Tuple_impl<0UL,_char_data_*&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super__Head_base<0UL,_char_data_*&,_false>._M_head_impl = args;
  GetCharacterData<char_data*&,std::__cxx11::string&>(&local_108,this,&local_40);
  local_c0._0_4_ = nTimer;
  local_b8._M_p = (pointer)&local_a8;
  pcVar1 = (from->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + from->_M_string_length);
  pcVar1 = (local_110->_M_dataplus)._M_p;
  local_98._M_p = (pointer)&local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + local_110->_M_string_length);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector(&local_78,&local_108);
  local_f0._8_8_ = *args;
  pcVar1 = (args_1->_M_dataplus)._M_p;
  local_f0._0_8_ = func;
  local_e0 = local_d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar1,pcVar1 + args_1->_M_string_length);
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string&>(int,std::__cxx11::string,std::__cxx11::string,void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string&)::_lambda()_1_,void>
            ((function<void()> *)local_60._M_pod_data,(anon_class_48_3_3bdf3dc2 *)local_f0);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::
  emplace_back<CQueue::queueEntry_t>(&this->newQueue,(queueEntry_t *)local_c0);
  if (local_50 != (_Manager_type)0x0) {
    (*local_50)(&local_60,&local_60,__destroy_functor);
  }
  if (local_78.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_p != &local_a8) {
    operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
  }
  if (local_e0 != local_d0) {
    operator_delete(local_e0,local_d0[0] + 1);
  }
  fmt_00._M_str = "Add => {} added {} with timer {}";
  fmt_00._M_len = 0x20;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)&Logger,fmt_00,from,local_110,&local_114);
  if (local_108.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}